

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O0

Command * __thiscall
QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
          (QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *__dest;
  long *in_RDI;
  Command *nv;
  
  if (*(int *)((long)in_RDI + 0xc) == (int)in_RDI[1]) {
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 0x400;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)in_RDI[1];
    uVar3 = SUB168(auVar2 * ZEXT816(0x68),0);
    if (SUB168(auVar2 * ZEXT816(0x68),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __dest = operator_new__(uVar3);
    if (*in_RDI != 0) {
      memcpy(__dest,(void *)*in_RDI,(long)*(int *)((long)in_RDI + 0xc) * 0x68);
      if ((void *)*in_RDI != (void *)0x0) {
        operator_delete__((void *)*in_RDI);
      }
    }
    *in_RDI = (long)__dest;
  }
  iVar1 = *(int *)((long)in_RDI + 0xc);
  *(int *)((long)in_RDI + 0xc) = iVar1 + 1;
  return (Command *)(*in_RDI + (long)iVar1 * 0x68);
}

Assistant:

inline T &get() {
        if (p == a) {
            a += GROW;
            T *nv = new T[a];
            if (v) {
                memcpy(nv, v, p * sizeof(T));
                delete[] v;
            }
            v = nv;
        }
        return v[p++];
    }